

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elsa.h
# Opt level: O3

size_t __thiscall
frozen::
unordered_set<C_A_T_C_H_T_E_S_T_6()::some_enum,2ul,frozen::elsa<C_A_T_C_H_T_E_S_T_6()::some_enum>,std::equal_to<C_A_T_C_H_T_E_S_T_6()::some_enum>>
::count<C_A_T_C_H_T_E_S_T_6()::some_enum>
          (unordered_set<C_A_T_C_H_T_E_S_T_6()::some_enum,2ul,frozen::elsa<C_A_T_C_H_T_E_S_T_6()::some_enum>,std::equal_to<C_A_T_C_H_T_E_S_T_6()::some_enum>>
           *this,some_enum *key)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = (int)key;
  uVar2 = *(ulong *)(this + 8) ^ (long)iVar4;
  uVar2 = uVar2 * 0x200000 + ~uVar2;
  uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
  uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
  uVar2 = *(ulong *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 3) * 8 + 0x10);
  if ((long)uVar2 < 0) {
    uVar2 = uVar2 ^ (long)iVar4;
    uVar2 = uVar2 * 0x200000 + ~uVar2;
    uVar2 = (uVar2 >> 0x18 ^ uVar2) * 0x109;
    uVar1 = ((uint)(uVar2 >> 0xe) ^ (uint)uVar2) * 0x15;
    uVar2 = *(ulong *)(this + (ulong)((uVar1 >> 0x1c ^ uVar1) & 3) * 8 + 0x30);
  }
  if ((uVar2 == 2) || (*(int *)(this + uVar2 * 4) != iVar4)) {
    lVar3 = 8;
  }
  else {
    lVar3 = uVar2 << 2;
  }
  return (ulong)(lVar3 != 8);
}

Assistant:

constexpr std::size_t operator()(T const &value, std::size_t seed) const {
    std::size_t key = seed ^ static_cast<std::size_t>(value);
    key = (~key) + (key << 21); // key = (key << 21) - key - 1;
    key = key ^ (key >> 24);
    key = (key + (key << 3)) + (key << 8); // key * 265
    key = key ^ (key >> 14);
    key = (key + (key << 2)) + (key << 4); // key * 21
    key = key ^ (key >> 28);
    key = key + (key << 31);
    return key;
  }